

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O0

Label * __thiscall wabt::ModuleContext::GetLabel(ModuleContext *this,Var *var)

{
  bool bVar1;
  __type _Var2;
  Index IVar3;
  string *__rhs;
  char *pcVar4;
  const_reference pvVar5;
  int __c;
  int __c_00;
  Var *__s;
  value_type *label_1;
  value_type *label;
  Index i;
  Var *var_local;
  ModuleContext *this_local;
  
  __s = var;
  bVar1 = Var::is_name(var);
  if (bVar1) {
    for (label._4_4_ = GetLabelStackSize(this); label._4_4_ != 0; label._4_4_ = label._4_4_ - 1) {
      pvVar5 = std::vector<wabt::Label,_std::allocator<wabt::Label>_>::operator[]
                         (&this->label_stack_,(ulong)(label._4_4_ - 1));
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==(&pvVar5->name,__rhs);
      if (_Var2) {
        return pvVar5;
      }
    }
  }
  else {
    pcVar4 = Var::index(var,(char *)__s,__c);
    IVar3 = GetLabelStackSize(this);
    if ((uint)pcVar4 < IVar3) {
      IVar3 = GetLabelStackSize(this);
      pcVar4 = Var::index(var,(char *)__s,__c_00);
      pvVar5 = std::vector<wabt::Label,_std::allocator<wabt::Label>_>::operator[]
                         (&this->label_stack_,(ulong)((IVar3 - (int)pcVar4) - 1));
      return pvVar5;
    }
  }
  return (Label *)0x0;
}

Assistant:

const Label* ModuleContext::GetLabel(const Var& var) const {
  if (var.is_name()) {
    for (Index i = GetLabelStackSize(); i > 0; --i) {
      auto label = &label_stack_[i - 1];
      if (label->name == var.name()) {
        return label;
      }
    }
  } else if (var.index() < GetLabelStackSize()) {
    auto label = &label_stack_[GetLabelStackSize() - var.index() - 1];
    return label;
  }
  return nullptr;
}